

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

ostream * docopt::operator<<(ostream *os,value *val)

{
  bool bVar1;
  const_iterator __lhs;
  ostream *poVar2;
  value *in_RSI;
  char *pcVar3;
  ostream *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *el;
  const_iterator __end5;
  const_iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  bool first;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list;
  string *str;
  long v;
  bool b;
  reference in_stack_ffffffffffffffa8;
  value *in_stack_ffffffffffffffb0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  byte local_31;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  string *local_28;
  long local_20;
  undefined1 local_11;
  value *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = value::isBool(in_RSI);
  if (bVar1) {
    local_11 = value::asBool(in_stack_ffffffffffffffb0);
    pcVar3 = "false";
    if ((bool)local_11) {
      pcVar3 = "true";
    }
    std::operator<<((ostream *)&std::cout,pcVar3);
  }
  else {
    bVar1 = value::isLong(local_10);
    if (bVar1) {
      local_20 = value::asLong(in_stack_ffffffffffffffb0);
      std::ostream::operator<<(&std::cout,local_20);
    }
    else {
      bVar1 = value::isString(local_10);
      if (bVar1) {
        local_28 = value::asString_abi_cxx11_(in_stack_ffffffffffffffb0);
        poVar2 = std::operator<<((ostream *)&std::cout,'\"');
        poVar2 = std::operator<<(poVar2,(string *)local_28);
        std::operator<<(poVar2,'\"');
      }
      else {
        bVar1 = value::isStringList(local_10);
        if (bVar1) {
          local_30 = value::asStringList_abi_cxx11_(in_stack_ffffffffffffffb0);
          std::operator<<((ostream *)&std::cout,"[");
          local_31 = 1;
          local_40 = local_30;
          local_48._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffffa8);
          __lhs = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffffa8);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)__lhs._M_current,
                                    (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)in_stack_ffffffffffffffa8), bVar1) {
            in_stack_ffffffffffffffa8 =
                 __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_48);
            if ((local_31 & 1) == 0) {
              std::operator<<((ostream *)&std::cout,", ");
            }
            else {
              local_31 = 0;
            }
            poVar2 = std::operator<<((ostream *)&std::cout,'\"');
            poVar2 = std::operator<<(poVar2,(string *)in_stack_ffffffffffffffa8);
            std::operator<<(poVar2,'\"');
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_48);
          }
          std::operator<<((ostream *)&std::cout,"]");
        }
        else {
          std::operator<<((ostream *)&std::cout,"null");
        }
      }
    }
  }
  return local_8;
}

Assistant:

std::ostream& docopt::operator<<(std::ostream& os, value const& val)
{
	if (val.isBool()) {
		bool b = val.asBool();
		std::cout << (b ? "true" : "false");
	} else if (val.isLong()) {
		long v = val.asLong();
		std::cout << v;
	} else if (val.isString()) {
		std::string const& str = val.asString();
		std::cout << '"' << str << '"';
	} else if (val.isStringList()) {
		auto const& list = val.asStringList();
		std::cout << "[";
		bool first = true;
		for(auto const& el : list) {
			if (first) {
				first = false;
			} else {
				std::cout << ", ";
			}
			std::cout << '"' << el << '"';
		}
		std::cout << "]";
	} else {
		std::cout << "null";
	}
	return os;
}